

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O2

Config * __thiscall QPDFJob::Config::jobJsonFile(Config *this,string *parameter)

{
  QPDFJob *this_00;
  char *in_RDX;
  string asStack_108 [7];
  
  this_00 = this->o;
  QUtil::read_file_into_string_abi_cxx11_(asStack_108,(QUtil *)(parameter->_M_dataplus)._M_p,in_RDX)
  ;
  initializeFromJson(this_00,asStack_108,true);
  std::__cxx11::string::~string((string *)asStack_108);
  return this;
}

Assistant:

QPDFJob::Config*
QPDFJob::Config::jobJsonFile(std::string const& parameter)
{
    try {
        o.initializeFromJson(QUtil::read_file_into_string(parameter.c_str()), true);
    } catch (std::exception& e) {
        throw std::runtime_error(
            "error with job-json file " + std::string(parameter) + ": " + e.what() + "\nRun " +
            this->o.m->message_prefix + " --job-json-help for information on the file format.");
    }
    return this;
}